

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O2

void __thiscall
prod_test::iu_PeepTest_x_iutest_x_PeepMacro_Test::Body(iu_PeepTest_x_iutest_x_PeepMacro_Test *this)

{
  int *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1d0;
  Fixed local_1a0;
  
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 4;
  *(undefined4 *)
   (s_prod + iutest::detail::peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProdClass>>::value) = 4;
  local_1d0.m_message._M_dataplus._M_p._0_4_ = s_prod._4_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x30b851,"s_prod.GetX()",(char *)&local_1a0,(int *)&local_1d0,
             in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x85,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 4;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x30b851,
             "(s_prod.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProdClass> >::value)",
             (char *)&local_1a0,
             (int *)(s_prod + iutest::detail::
                              peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProdClass>>::value),
             in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x87,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  *(undefined4 *)
   ((long)&s_prod2 +
   iutest::detail::peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProdClass2>>::value) = 0x2a;
  local_1d0.m_message._M_dataplus._M_p._0_4_ = s_prod2;
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x2a;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"42","s_prod2.GetX()",(char *)&local_1a0,(int *)&local_1d0,in_R9
            );
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x8a,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x2a;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"42",
             "(s_prod2.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProdClass2> >::value)",
             (char *)&local_1a0,
             (int *)((long)&s_prod2 +
                    iutest::detail::peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProdClass2>>::
                    value),in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x8c,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  *(undefined4 *)
   ((long)&DAT_003a03cf +
   iutest::detail::peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProtectedProdClass>>::value + 1) =
       0x2a;
  local_1d0.m_message._M_dataplus._M_p._0_4_ = ram0x003a03d0;
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x2a;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"42","s_protected.GetX()",(char *)&local_1a0,(int *)&local_1d0,
             in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x8f,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x2a;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"42",
             "(s_protected.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProtectedProdClass> >::value)"
             ,(char *)&local_1a0,
             (int *)((long)&DAT_003a03cf +
                    iutest::detail::
                    peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProtectedProdClass>>::value + 1),
             in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x91,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(PeepTest, PeepMacro)
{
    IUTEST_PEEP_GET(s_prod, ProdClass, m_x) = 4;
    IUTEST_EXPECT_EQ(4, s_prod.GetX());

    IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(s_prod, ProdClass, m_x));

    IUTEST_PEEP_GET(s_prod2, ProdClass2, m_x) = 42;
    IUTEST_EXPECT_EQ(42, s_prod2.GetX());

    IUTEST_EXPECT_EQ(42, IUTEST_PEEP_GET(s_prod2, ProdClass2, m_x));

    IUTEST_PEEP_GET(s_protected, ProtectedProdClass, m_x) = 42;
    IUTEST_EXPECT_EQ(42, s_protected.GetX());

    IUTEST_EXPECT_EQ(42, IUTEST_PEEP_GET(s_protected, ProtectedProdClass, m_x));
}